

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfscursor.cpp
# Opt level: O3

void __thiscall QEglFSCursor::changeCursor(QEglFSCursor *this,QCursor *cursor,QWindow *window)

{
  bool bVar1;
  long in_FS_OFFSET;
  QRect local_40;
  QRect local_30;
  QRect local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.x1.m_i = *(int *)(this + 0x60) - *(int *)(this + 0x40);
  local_20.x2.m_i = *(int *)(this + 0x38) + local_20.x1.m_i + -1;
  local_20.y1.m_i = *(int *)(this + 100) - *(int *)(this + 0x44);
  local_20.y2.m_i = *(int *)(this + 0x3c) + (*(int *)(this + 100) - *(int *)(this + 0x44)) + -1;
  bVar1 = setCurrentCursor(this,cursor);
  if (bVar1) {
    local_40.x1.m_i = *(int *)(this + 0x60) - *(int *)(this + 0x40);
    local_40.x2.m_i = *(int *)(this + 0x38) + local_40.x1.m_i + -1;
    local_40.y1.m_i = *(int *)(this + 100) - *(int *)(this + 0x44);
    local_40.y2.m_i = *(int *)(this + 0x3c) + (*(int *)(this + 100) - *(int *)(this + 0x44)) + -1;
    local_30 = (QRect)QRect::operator|(&local_20,&local_40);
    update(this,&local_30,false);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEglFSCursor::changeCursor(QCursor *cursor, QWindow *window)
{
    Q_UNUSED(window);
    const QRect oldCursorRect = cursorRect();
    if (setCurrentCursor(cursor))
        update(oldCursorRect | cursorRect(), false);
}